

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bloaty.cc
# Opt level: O0

void __thiscall bloaty::Bloaty::AddDebugFilename(Bloaty *this,string *filename)

{
  string_view format;
  pointer pOVar1;
  long lVar2;
  mapped_type *this_00;
  string *in_RSI;
  string build_id;
  unique_ptr<bloaty::ObjectFile,_std::default_delete<bloaty::ObjectFile>_> object_file;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff28;
  Arg *in_stack_ffffffffffffff30;
  char *in_stack_ffffffffffffff38;
  int line;
  basic_string_view<char,_std::char_traits<char>_> *in_stack_ffffffffffffff40;
  char *str;
  Arg *in_stack_ffffffffffffff58;
  size_t in_stack_ffffffffffffff60;
  key_type *in_stack_ffffffffffffff68;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *in_stack_ffffffffffffff70;
  string local_38 [8];
  string *in_stack_ffffffffffffffd0;
  Bloaty *in_stack_ffffffffffffffd8;
  
  GetObjectFile(in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd0);
  pOVar1 = std::unique_ptr<bloaty::ObjectFile,_std::default_delete<bloaty::ObjectFile>_>::operator->
                     ((unique_ptr<bloaty::ObjectFile,_std::default_delete<bloaty::ObjectFile>_> *)
                      0x18bd58);
  (*pOVar1->_vptr_ObjectFile[2])(local_38);
  lVar2 = std::__cxx11::string::size();
  if (lVar2 == 0) {
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (in_stack_ffffffffffffff40,in_stack_ffffffffffffff38);
    line = (int)((ulong)in_stack_ffffffffffffff38 >> 0x20);
    str = &stack0xffffffffffffff58;
    absl::substitute_internal::Arg::Arg<std::allocator<char>>
              (in_stack_ffffffffffffff30,in_stack_ffffffffffffff28);
    format._M_str = (char *)in_stack_ffffffffffffff68;
    format._M_len = in_stack_ffffffffffffff60;
    absl::Substitute_abi_cxx11_(format,in_stack_ffffffffffffff58);
    std::__cxx11::string::c_str();
    Throw(str,line);
  }
  this_00 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::operator[](in_stack_ffffffffffffff70,in_stack_ffffffffffffff68);
  std::__cxx11::string::operator=((string *)this_00,in_RSI);
  std::__cxx11::string::~string(local_38);
  std::unique_ptr<bloaty::ObjectFile,_std::default_delete<bloaty::ObjectFile>_>::~unique_ptr
            ((unique_ptr<bloaty::ObjectFile,_std::default_delete<bloaty::ObjectFile>_> *)in_RSI);
  return;
}

Assistant:

void Bloaty::AddDebugFilename(const std::string& filename) {
  auto object_file = GetObjectFile(filename);
  std::string build_id = object_file->GetBuildId();
  if (build_id.size() == 0) {
    THROWF("File '$0' has no build ID, cannot be used as a debug file",
           filename);
  }
  debug_files_[build_id] = filename;
}